

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O0

Norm * __thiscall icu_63::Norms::createNorm(Norms *this,UChar32 c)

{
  UMutableCPTrie *trie;
  uint32_t uVar1;
  ulong uVar2;
  UErrorCode *pErrorCode;
  undefined1 local_40 [8];
  IcuToolErrorCode errorCode;
  Norm *p;
  uint32_t i;
  UChar32 c_local;
  Norms *this_local;
  
  uVar1 = umutablecptrie_get_63(this->normTrie,c);
  if (uVar1 == 0) {
    errorCode.location = (char *)allocNorm(this);
    IcuToolErrorCode::IcuToolErrorCode((IcuToolErrorCode *)local_40,"gennorm2/createNorm()");
    trie = this->normTrie;
    uVar2 = (long)errorCode.location - (long)this->norms;
    pErrorCode = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_40);
    umutablecptrie_set_63(trie,c,(uint32_t)(uVar2 >> 6),pErrorCode);
    this_local = (Norms *)errorCode.location;
    IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)local_40);
  }
  else {
    this_local = (Norms *)(this->norms + uVar1);
  }
  return (Norm *)this_local;
}

Assistant:

Norm *Norms::createNorm(UChar32 c) {
    uint32_t i=umutablecptrie_get(normTrie, c);
    if(i!=0) {
        return norms+i;
    } else {
        /* allocate Norm */
        Norm *p=allocNorm();
        IcuToolErrorCode errorCode("gennorm2/createNorm()");
        umutablecptrie_set(normTrie, c, (uint32_t)(p - norms), errorCode);
        return p;
    }
}